

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprIsTableConstraint(Expr *pExpr,SrcItem *pSrc)

{
  byte bVar1;
  Walker local_30;
  
  bVar1 = (pSrc->fg).jointype;
  if ((bVar1 & 0x40) == 0) {
    if ((bVar1 & 8) == 0) {
      if ((pExpr->flags & 1) == 0) {
LAB_0019ca7c:
        local_30.u.n = pSrc->iCursor;
        local_30.eCode = 3;
        local_30.xExprCallback = exprNodeIsConstant;
        local_30.xSelectCallback = sqlite3SelectWalkFail;
        if (pExpr != (Expr *)0x0) {
          walkExpr(&local_30,pExpr);
        }
        return (int)local_30.eCode;
      }
    }
    else if (((pExpr->flags & 1) != 0) && ((pExpr->w).iJoin == pSrc->iCursor)) goto LAB_0019ca7c;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsTableConstraint(Expr *pExpr, const SrcItem *pSrc){
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor); /* rules (1), (2) */
}